

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O2

void __thiscall wallet::wallet_tests::ComputeTimeSmart::test_method(ComputeTimeSmart *this)

{
  CWallet *wallet;
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  int64_t *piVar2;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  char *local_a8;
  char *local_a0;
  undefined4 local_94;
  int64_t local_90;
  char *local_88;
  char *local_80;
  undefined **local_78;
  undefined1 local_70;
  undefined1 *local_68;
  char *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  char *local_48;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_40 = "";
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x1aa;
  file.m_begin = (iterator)&local_48;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_58,msg);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_01139f30;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_80 = "";
  wallet = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_wallet;
  local_90 = AddTx((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.
                   super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                   super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                   .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl,wallet,1,100,0x78
                  );
  piVar2 = &local_90;
  local_94 = 100;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (&local_78,&local_88,0x1aa,1,2,piVar2,"AddTx(*m_node.chainman, m_wallet, 1, 100, 120)",
             &local_94,"100");
  local_a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_a0 = "";
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)piVar2;
  msg_00.m_begin = pvVar1;
  file_00.m_end = (iterator)0x1ad;
  file_00.m_begin = (iterator)&local_a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_b8,msg_00
            );
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_01139f30;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_c0 = "";
  local_90 = AddTx((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.
                   super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                   super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                   .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl,wallet,1,200,0xdc
                  );
  piVar2 = &local_90;
  local_94 = 100;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (&local_78,&local_c8,0x1ad,1,2,piVar2,"AddTx(*m_node.chainman, m_wallet, 1, 200, 220)",
             &local_94,"100");
  local_d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_d0 = "";
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = (iterator)piVar2;
  msg_01.m_begin = pvVar1;
  file_01.m_end = (iterator)0x1b0;
  file_01.m_begin = (iterator)&local_d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_e8,msg_01
            );
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_01139f30;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_f0 = "";
  local_90 = AddTx((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.
                   super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                   super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                   .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl,wallet,2,300,0);
  piVar2 = &local_90;
  local_94 = 300;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (&local_78,&local_f8,0x1b0,1,2,piVar2,"AddTx(*m_node.chainman, m_wallet, 2, 300, 0)",
             &local_94,"300");
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_100 = "";
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = (iterator)piVar2;
  msg_02.m_begin = pvVar1;
  file_02.m_end = (iterator)0x1b3;
  file_02.m_begin = (iterator)&local_108;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_118,
             msg_02);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_01139f30;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_120 = "";
  local_90 = AddTx((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.
                   super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                   super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                   .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl,wallet,3,0x1a4,
                   400);
  piVar2 = &local_90;
  local_94 = 400;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (&local_78,&local_128,0x1b3,1,2,piVar2,"AddTx(*m_node.chainman, m_wallet, 3, 420, 400)",
             &local_94,"400");
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = (iterator)piVar2;
  msg_03.m_begin = pvVar1;
  file_03.m_end = (iterator)0x1b7;
  file_03.m_begin = (iterator)&local_138;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_148,
             msg_03);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_01139f30;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_150 = "";
  local_90 = AddTx((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.
                   super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                   super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                   .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl,wallet,4,500,
                   0x186);
  piVar2 = &local_90;
  local_94 = 400;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (&local_78,&local_158,0x1b7,1,2,piVar2,"AddTx(*m_node.chainman, m_wallet, 4, 500, 390)",
             &local_94,"400");
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = (iterator)piVar2;
  msg_04.m_begin = pvVar1;
  file_04.m_end = (iterator)0x1bb;
  file_04.m_begin = (iterator)&local_168;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_178,
             msg_04);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_01139f30;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_180 = "";
  local_90 = AddTx((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.
                   super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                   super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                   .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl,wallet,5,0x32,600
                  );
  local_94 = 300;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (&local_78,&local_188,0x1bb,1,2,&local_90,
             "AddTx(*m_node.chainman, m_wallet, 5, 50, 600)",&local_94,"300");
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(ComputeTimeSmart)
{
    // New transaction should use clock time if lower than block time.
    BOOST_CHECK_EQUAL(AddTx(*m_node.chainman, m_wallet, 1, 100, 120), 100);

    // Test that updating existing transaction does not change smart time.
    BOOST_CHECK_EQUAL(AddTx(*m_node.chainman, m_wallet, 1, 200, 220), 100);

    // New transaction should use clock time if there's no block time.
    BOOST_CHECK_EQUAL(AddTx(*m_node.chainman, m_wallet, 2, 300, 0), 300);

    // New transaction should use block time if lower than clock time.
    BOOST_CHECK_EQUAL(AddTx(*m_node.chainman, m_wallet, 3, 420, 400), 400);

    // New transaction should use latest entry time if higher than
    // min(block time, clock time).
    BOOST_CHECK_EQUAL(AddTx(*m_node.chainman, m_wallet, 4, 500, 390), 400);

    // If there are future entries, new transaction should use time of the
    // newest entry that is no more than 300 seconds ahead of the clock time.
    BOOST_CHECK_EQUAL(AddTx(*m_node.chainman, m_wallet, 5, 50, 600), 300);
}